

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::NullTypeHandlerBase::GetProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  ScriptContext *this_00;
  bool bVar1;
  BOOL BVar2;
  RecyclableObject *pRVar3;
  uint32 local_34 [2];
  uint32 indexVal;
  
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  bVar1 = DynamicObject::HasObjectArray(instance);
  if ((bVar1) &&
     (BVar2 = ScriptContext::IsNumericPropertyId(this_00,propertyId,local_34), BVar2 != 0)) {
    BVar2 = DynamicTypeHandler::GetItem
                      (&this->super_DynamicTypeHandler,instance,originalInstance,local_34[0],value,
                       requestContext);
    return BVar2;
  }
  pRVar3 = ScriptContext::GetMissingPropertyResult(requestContext);
  *value = pRVar3;
  return 0;
}

Assistant:

BOOL NullTypeHandlerBase::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // Check numeric propertyId only if objectArray is available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return DynamicTypeHandler::GetItem(instance, originalInstance, indexVal, value, requestContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }